

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O3

void InstructionSet::M68k::Primitive::
     shift<(InstructionSet::M68k::Operation)75,unsigned_int,CPU::MC68000::ProcessorBase>
               (uint32_t source,uint *destination,Status *status,ProcessorBase *flow_controller)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar5 = source & 0x3f;
  flow_controller->dynamic_instruction_length_ = uVar5 + 2;
  if (uVar5 == 0) {
    status->overflow_flag = 0;
    status->carry_flag = 0;
    uVar3 = *destination;
  }
  else {
    if (uVar5 < 0x21) {
      uVar1 = *destination;
      uVar4 = (ulong)((uVar1 >> (uVar5 - 1 & 0x1f) & 1) != 0);
      status->extend_flag = uVar4;
      status->carry_flag = uVar4;
      status->overflow_flag = 0;
      uVar3 = (int)uVar1 >> 0x1f;
      if (uVar5 != 0x20) {
        bVar2 = (byte)uVar5 & 0x1f;
        uVar3 = uVar1 >> bVar2 | uVar3 << 0x20 - bVar2;
      }
    }
    else {
      status->carry_flag = 0;
      status->extend_flag = 0;
      status->overflow_flag = 0;
      uVar3 = (int)*destination >> 0x1f;
    }
    *destination = uVar3;
  }
  status->zero_result = (ulong)uVar3;
  status->negative_flag = (ulong)(uVar3 & 0x80000000);
  return;
}

Assistant:

int shift_count(uint8_t source, FlowController &flow_controller) {
	const int count = source & 63;
	flow_controller.template did_shift<IntT>(count);
	return count;
}